

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynarray.c
# Opt level: O1

size_t sysbvm_dynarray_addAll(sysbvm_dynarray_t *dynarray,size_t entryCount,void *newEntries)

{
  ulong uVar1;
  size_t sVar2;
  uint8_t *__src;
  ulong uVar3;
  uint8_t *__dest;
  ulong uVar4;
  size_t sVar5;
  
  sVar5 = dynarray->size;
  uVar4 = dynarray->capacity;
  uVar1 = sVar5 + entryCount;
  if (uVar4 < uVar1) {
    uVar3 = 0x10;
    if (0x10 < uVar4) {
      uVar3 = uVar4;
    }
    do {
      uVar4 = uVar3;
      uVar3 = uVar4 * 2;
    } while (uVar4 < uVar1);
    sVar2 = dynarray->entrySize;
    __dest = (uint8_t *)malloc(sVar2 * uVar4);
    __src = dynarray->data;
    memcpy(__dest,__src,sVar5 * sVar2);
    free(__src);
    dynarray->capacity = uVar4;
    dynarray->data = __dest;
  }
  memcpy(dynarray->data + dynarray->size * dynarray->entrySize,newEntries,
         dynarray->entrySize * entryCount);
  sVar5 = entryCount + dynarray->size;
  dynarray->size = sVar5;
  return sVar5;
}

Assistant:

size_t sysbvm_dynarray_addAll(sysbvm_dynarray_t *dynarray, size_t entryCount, const void *newEntries)
{
    size_t requiredCapacity = dynarray->size + entryCount;
    if(requiredCapacity > dynarray->capacity)
    {
        size_t newCapacity = dynarray->capacity;
        if(newCapacity < 16)
            newCapacity = 16;

        while(newCapacity < requiredCapacity)
            newCapacity *= 2;

        uint8_t *newStorage = (uint8_t*)malloc(dynarray->entrySize * newCapacity);
        memcpy(newStorage, dynarray->data, dynarray->entrySize * dynarray->size);
        free(dynarray->data);

        dynarray->capacity = newCapacity;
        dynarray->data = newStorage;
    }

    memcpy(dynarray->data + dynarray->size*dynarray->entrySize, newEntries, entryCount*dynarray->entrySize);
    dynarray->size += entryCount;
    return dynarray->size;
}